

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert-expr.c
# Opt level: O0

_Bool eval(ExprNode *en,char *hostname,uint port)

{
  _Bool _Var1;
  int iVar2;
  bool local_41;
  ulong local_38;
  size_t i_1;
  size_t i;
  uint port_local;
  char *hostname_local;
  ExprNode *en_local;
  
  switch(en->op) {
  case OP_AND:
    for (i_1 = 0; i_1 < (en->field_2).field_0.nsubexprs; i_1 = i_1 + 1) {
      _Var1 = eval((en->field_2).field_0.subexprs[i_1],hostname,port);
      if (!_Var1) {
        return false;
      }
    }
    en_local._7_1_ = true;
    break;
  case OP_OR:
    for (local_38 = 0; local_38 < (en->field_2).field_0.nsubexprs; local_38 = local_38 + 1) {
      _Var1 = eval((en->field_2).field_0.subexprs[local_38],hostname,port);
      if (_Var1) {
        return true;
      }
    }
    en_local._7_1_ = false;
    break;
  case OP_NOT:
    _Var1 = eval((ExprNode *)(en->field_2).field_0.subexprs,hostname,port);
    en_local._7_1_ = (bool)((_Var1 ^ 0xffU) & 1);
    break;
  case OP_HOSTNAME_WC:
    iVar2 = wc_match((char *)(en->field_2).field_0.subexprs,hostname);
    en_local._7_1_ = iVar2 != 0;
    break;
  case OP_PORT_RANGE:
    local_41 = false;
    if ((en->field_2).field_3.lo <= port) {
      local_41 = port <= (en->field_2).field_3.hi;
    }
    en_local._7_1_ = local_41;
    break;
  default:
    __assert_fail("false && \"unhandled node type in eval\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/cert-expr.c"
                  ,0x253,"_Bool eval(ExprNode *, const char *, unsigned int)");
  }
  return en_local._7_1_;
}

Assistant:

static bool eval(ExprNode *en, const char *hostname, unsigned port)
{
    switch (en->op) {
      case OP_AND:
        for (size_t i = 0; i < en->nsubexprs; i++)
            if (!eval(en->subexprs[i], hostname, port))
                return false;
        return true;

      case OP_OR:
        for (size_t i = 0; i < en->nsubexprs; i++)
            if (eval(en->subexprs[i], hostname, port))
                return true;
        return false;

      case OP_NOT:
        return !eval(en->subexpr, hostname, port);

      case OP_HOSTNAME_WC:
        return wc_match(en->wc, hostname);

      case OP_PORT_RANGE:
        return en->lo <= port && port <= en->hi;

      default:
        unreachable("unhandled node type in eval");
    }
}